

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

int32_t icu_63::RelativeDateFormat::dayDifference(Calendar *cal,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  UDate date;
  int32_t dayDiff;
  Calendar *nowCal;
  UErrorCode *status_local;
  Calendar *cal_local;
  Calendar *this;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = (*(cal->super_UObject)._vptr_UObject[3])();
    this = (Calendar *)CONCAT44(extraout_var,iVar2);
    date = Calendar::getNow();
    Calendar::setTime(this,date,status);
    iVar3 = Calendar::get(cal,UCAL_JULIAN_DAY,status);
    iVar4 = Calendar::get(this,UCAL_JULIAN_DAY,status);
    cal_local._4_4_ = iVar3 - iVar4;
    if (this != (Calendar *)0x0) {
      (*(this->super_UObject)._vptr_UObject[1])();
    }
  }
  else {
    cal_local._4_4_ = 0;
  }
  return cal_local._4_4_;
}

Assistant:

int32_t RelativeDateFormat::dayDifference(Calendar &cal, UErrorCode &status) {
    if(U_FAILURE(status)) {
        return 0;
    }
    // TODO: Cache the nowCal to avoid heap allocs? Would be difficult, don't know the calendar type
    Calendar *nowCal = cal.clone();
    nowCal->setTime(Calendar::getNow(), status);

    // For the day difference, we are interested in the difference in the (modified) julian day number
    // which is midnight to midnight.  Using fieldDifference() is NOT correct here, because 
    // 6pm Jan 4th  to 10am Jan 5th should be considered "tomorrow".
    int32_t dayDiff = cal.get(UCAL_JULIAN_DAY, status) - nowCal->get(UCAL_JULIAN_DAY, status);

    delete nowCal;
    return dayDiff;
}